

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clownlzss.c
# Opt level: O0

int ClownLZSS_FindOptimalMatches
              (int filler_value,size_t maximum_match_length,size_t maximum_match_distance,
              _func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr
              *extra_matches_callback,size_t literal_cost,
              _func_size_t_size_t_size_t_void_ptr *match_cost_callback,uchar *data,
              size_t bytes_per_value,size_t total_values,ClownLZSS_Match **_matches,
              size_t *_total_matches,void *user)

{
  uchar uVar1;
  uchar uVar2;
  ClownLZSS_Match *pCVar3;
  long lVar4;
  ClownLZSS_Match *pCVar5;
  anon_union_8_2_f60ed377_for_u *paVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  ulong local_100;
  size_t offset;
  size_t next_index;
  size_t cost;
  uchar match_byte_1;
  uchar current_byte_1;
  uchar match_byte;
  ulong uStack_d0;
  uchar current_byte;
  size_t l;
  uchar *match_bytes;
  uchar *current_bytes;
  uint start;
  size_t distance;
  size_t j;
  size_t current_string;
  size_t string_list_head;
  size_t match_string;
  size_t DUMMY;
  size_t *next;
  size_t *prev;
  size_t total_matches;
  ClownLZSS_Match *matches;
  size_t i;
  ClownLZSS_GraphEdge *node_meta_array;
  size_t string_list_buffer_length;
  size_t node_meta_array_length;
  int success;
  _func_size_t_size_t_size_t_void_ptr *match_cost_callback_local;
  size_t literal_cost_local;
  _func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *extra_matches_callback_local;
  size_t maximum_match_distance_local;
  size_t maximum_match_length_local;
  int filler_value_local;
  
  node_meta_array_length._4_4_ = 0;
  if (total_values == 0) {
    *_matches = (ClownLZSS_Match *)0x0;
    *_total_matches = 0;
    node_meta_array_length._4_4_ = 1;
  }
  else {
    lVar4 = total_values + 1;
    pCVar5 = (ClownLZSS_Match *)malloc(lVar4 * 0x18 + (maximum_match_distance * 2 + 0x100) * 8);
    if (pCVar5 != (ClownLZSS_Match *)0x0) {
      paVar6 = (anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source + maximum_match_distance;
      for (matches = (ClownLZSS_Match *)0x0; matches < (ClownLZSS_Match *)0x100;
          matches = (ClownLZSS_Match *)((long)&matches->source + 1)) {
        paVar6[(long)&matches->source + maximum_match_distance].cost = 0xffffffffffffffff;
      }
      if (filler_value == -1) {
        for (matches = (ClownLZSS_Match *)0x0; matches < maximum_match_distance;
            matches = (ClownLZSS_Match *)((long)&matches->source + 1)) {
          ((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[(long)matches].cost =
               0xffffffffffffffff;
        }
      }
      else {
        paVar6[maximum_match_distance + (long)filler_value].cost = maximum_match_distance - 1;
        paVar6->cost = 0xffffffffffffffff;
        *(size_t *)((long)pCVar5 + (maximum_match_distance - 1) * 8 + lVar4 * 0x18) =
             maximum_match_distance + (long)filler_value;
        for (matches = (ClownLZSS_Match *)0x0;
            matches < (ClownLZSS_Match *)(maximum_match_distance - 1);
            matches = (ClownLZSS_Match *)((long)&matches->source + 1)) {
          paVar6[(long)((long)&matches->source + 1)] = (anon_union_8_2_f60ed377_for_u)matches;
          ((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[(long)matches].cost =
               (size_t)((long)&matches->source + 1);
        }
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar5->source)->cost = 0;
      for (matches = (ClownLZSS_Match *)0x1; matches < (ClownLZSS_Match *)(total_values + 1);
          matches = (ClownLZSS_Match *)((long)&matches->source + 1)) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost = 0xffffffffffffffff;
      }
      for (matches = (ClownLZSS_Match *)0x0; matches < total_values;
          matches = (ClownLZSS_Match *)((long)&matches->source + 1)) {
        sVar7 = maximum_match_distance + data[(long)matches * bytes_per_value];
        uVar9 = (ulong)matches % maximum_match_distance;
        if (extra_matches_callback !=
            (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)0x0) {
          (*extra_matches_callback)
                    (data,total_values,(size_t)matches,(ClownLZSS_GraphEdge *)pCVar5,user);
        }
        for (string_list_head = paVar6[sVar7].cost; string_list_head != 0xffffffffffffffff;
            string_list_head = paVar6[string_list_head].cost) {
          sVar10 = ((long)matches + (maximum_match_distance - string_list_head) + -1) %
                   maximum_match_distance + 1;
          match_bytes = data + ((long)&matches->source + (ulong)(uint)(bytes_per_value == 1)) *
                               bytes_per_value;
          l = (long)match_bytes - sVar10 * bytes_per_value;
          distance = (size_t)(uint)(bytes_per_value == 1);
          while( true ) {
            local_100 = maximum_match_length;
            if (total_values - (long)matches <= maximum_match_length) {
              local_100 = total_values - (long)matches;
            }
            if (local_100 <= distance) break;
            if (l < data) {
              uStack_d0 = 0;
              while ((uStack_d0 < bytes_per_value &&
                     (uVar1 = *match_bytes, match_bytes = match_bytes + 1,
                     uVar1 == (uchar)filler_value))) {
                uStack_d0 = uStack_d0 + 1;
              }
              l = bytes_per_value + l;
            }
            else {
              for (uStack_d0 = 0; uStack_d0 < bytes_per_value; uStack_d0 = uStack_d0 + 1) {
                uVar1 = *match_bytes;
                uVar2 = *(uchar *)l;
                match_bytes = match_bytes + 1;
                l = l + 1;
                if (uVar1 != uVar2) break;
              }
            }
            if (uStack_d0 != bytes_per_value) break;
            sVar8 = (*match_cost_callback)(sVar10,distance + 1,user);
            if ((sVar8 != 0) &&
               (((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost + sVar8 <
                ((anon_union_8_2_f60ed377_for_u *)
                &pCVar5[(long)&matches->source + distance + 1].source)->cost)) {
              ((anon_union_8_2_f60ed377_for_u *)
              &pCVar5[(long)&matches->source + distance + 1].source)->cost =
                   ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost + sVar8;
              pCVar5[(long)&matches->source + distance + 1].destination = (size_t)matches;
              pCVar5[(long)&matches->source + distance + 1].length = (long)matches - sVar10;
            }
            distance = distance + 1;
          }
        }
        if (((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost + literal_cost <=
            ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)((long)&matches->source + 1)].source)->
            cost) {
          ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)((long)&matches->source + 1)].source)->
          cost = ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost +
                 literal_cost;
          pCVar5[(long)((long)&matches->source + 1)].destination = (size_t)matches;
          pCVar5[(long)((long)&matches->source + 1)].length = (size_t)((long)&matches->source + 1);
        }
        if (((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[uVar9].cost !=
            0xffffffffffffffff) {
          paVar6[((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[uVar9].cost].cost =
               0xffffffffffffffff;
        }
        ((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[uVar9].cost = sVar7;
        paVar6[uVar9] = paVar6[sVar7];
        if (paVar6[uVar9].cost != 0xffffffffffffffff) {
          ((anon_union_8_2_f60ed377_for_u *)&pCVar5[lVar4].source)[paVar6[uVar9].cost].cost = uVar9;
        }
        paVar6[sVar7].cost = uVar9;
      }
      pCVar5->destination = 0xffffffffffffffff;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar5[total_values].source)->cost = 0xffffffffffffffff;
      for (matches = (ClownLZSS_Match *)total_values;
          pCVar5[(long)matches].destination != 0xffffffffffffffff;
          matches = (ClownLZSS_Match *)pCVar5[(long)matches].destination) {
        *(ClownLZSS_Match **)&pCVar5[pCVar5[(long)matches].destination].source = matches;
      }
      prev = (size_t *)0x0;
      matches = (ClownLZSS_Match *)0x0;
      while (((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost !=
             0xffffffffffffffff) {
        pCVar3 = (ClownLZSS_Match *)
                 ((anon_union_8_2_f60ed377_for_u *)&pCVar5[(long)matches].source)->cost;
        *(size_t *)&pCVar5[(long)prev].source = pCVar5[(long)pCVar3].length;
        pCVar5[(long)prev].destination = (size_t)matches;
        pCVar5[(long)prev].length = (long)pCVar3 - (long)matches;
        prev = (size_t *)((long)prev + 1);
        matches = pCVar3;
      }
      *_matches = pCVar5;
      *_total_matches = (size_t)prev;
      node_meta_array_length._4_4_ = 1;
    }
  }
  return node_meta_array_length._4_4_;
}

Assistant:

int ClownLZSS_FindOptimalMatches(
	const int filler_value,
	const size_t maximum_match_length,
	const size_t maximum_match_distance,
	void (* const extra_matches_callback)(const unsigned char *data, size_t total_values, size_t offset, ClownLZSS_GraphEdge *node_meta_array, void *user),
	const size_t literal_cost,
	size_t (* const match_cost_callback)(size_t distance, size_t length, void *user),
	const unsigned char* const data,
	const size_t bytes_per_value,
	const size_t total_values,
	ClownLZSS_Match** const _matches,
	size_t* const _total_matches,
	const void* const user
)
{
	int success;

	success = 0;

	/* Handle the edge-case where the data is empty. */
	if (total_values == 0)
	{
		*_matches = NULL;
		*_total_matches = 0;
		success = 1;
	}
	else
	{
		const size_t node_meta_array_length = total_values + 1; /* +1 for the end-node */
		const size_t string_list_buffer_length = maximum_match_distance * 2 + 0x100;
		ClownLZSS_GraphEdge* const node_meta_array = (ClownLZSS_GraphEdge*)malloc(node_meta_array_length * sizeof(ClownLZSS_GraphEdge) + string_list_buffer_length * sizeof(size_t));

		if (node_meta_array != NULL)
		{
			size_t i;
			ClownLZSS_Match *matches;
			size_t total_matches;

			size_t* const prev = (size_t*)&node_meta_array[node_meta_array_length];
			size_t* const next = &prev[maximum_match_distance];
			const size_t DUMMY = -1;

			/* Initialise the string list heads */
			for (i = 0; i < 0x100; ++i)
				next[maximum_match_distance + i] = DUMMY;

			if (filler_value == -1)
			{
				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance; ++i)
					prev[i] = DUMMY;
			}
			else
			{
				next[maximum_match_distance + filler_value] = maximum_match_distance - 1;
				next[0] = DUMMY;
				prev[maximum_match_distance - 1] = maximum_match_distance + filler_value;

				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance - 1; ++i)
				{
					next[i + 1] = i;
					prev[i] = i + 1;
				}
			}

			/* Set costs to maximum possible value, so later comparisons work */
			node_meta_array[0].u.cost = 0;
			for (i = 1; i < total_values + 1; ++i)
				node_meta_array[i].u.cost = DUMMY;

			/* Search for matches, to populate the edges of the LZSS graph.
			   Notably, while doing this, we're also using a shortest-path
			   algorithm on the edges to find the best combination of matches
			   to produce the smallest file. */

			/* Advance through the data one step at a time */
			for (i = 0; i < total_values; ++i)
			{
				size_t match_string;

				const size_t string_list_head = maximum_match_distance + data[i * bytes_per_value];
				const size_t current_string = i % maximum_match_distance;

				if (extra_matches_callback != NULL)
					extra_matches_callback(data, total_values, i, node_meta_array, (void*)user);

				/* `string_list_head` points to a linked-list of strings in the LZSS sliding window that match at least
				   one byte with the current string: iterate over it and generate every possible match for this string */
				for (match_string = next[string_list_head]; match_string != DUMMY; match_string = next[match_string])
				{
					size_t j;

					const size_t distance = ((maximum_match_distance + i - match_string - 1) % maximum_match_distance) + 1;
					/* If `BYTES_PER_VALUE` is not 1, then we have to re-evaluate the first value, otherwise we can skip it */
					const unsigned int start = bytes_per_value == 1;
					const unsigned char *current_bytes = &data[(i + start) * bytes_per_value];
					const unsigned char *match_bytes = current_bytes - distance * bytes_per_value;

					for (j = start; j < CLOWNLZSS_MIN(maximum_match_length, total_values - i); ++j)
					{
						size_t l;

						if (match_bytes < data)
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = (unsigned char)filler_value;

								++current_bytes;

								if (current_byte != match_byte)
									break;
							}

							match_bytes += bytes_per_value;
						}
						else
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = *match_bytes;

								++current_bytes;
								++match_bytes;

								if (current_byte != match_byte)
									break;
							}
						}

						if (l != bytes_per_value)
						{
							/* No match: give up on the current run */
							break;
						}
						else
						{
							/* Figure out how much it costs to encode the current run */
							const size_t cost = match_cost_callback(distance, j + 1, (void*)user);

							/* Figure out if the cost is lower than that of any other runs that end at the same value as this one */
							if (cost != 0 && node_meta_array[i + j + 1].u.cost > node_meta_array[i].u.cost + cost)
							{
								/* Record this new best run in the graph edge assigned to the value at the end of the run */
								node_meta_array[i + j + 1].u.cost = node_meta_array[i].u.cost + cost;
								node_meta_array[i + j + 1].previous_node_index = i;
								node_meta_array[i + j + 1].match_offset = i - distance;
							}
						}
					}
				}

				/* If a literal match is more efficient than all runs assigned to this value, then use that instead */
				if (node_meta_array[i + 1].u.cost >= node_meta_array[i].u.cost + literal_cost)
				{
					node_meta_array[i + 1].u.cost = node_meta_array[i].u.cost + literal_cost;
					node_meta_array[i + 1].previous_node_index = i;
					node_meta_array[i + 1].match_offset = i + 1;
				}

				/* Replace the oldest string in the list with the new string, since it's about to be pushed out of the LZSS sliding window */

				/* Detach the old node in this slot */
				if (prev[current_string] != DUMMY)
					next[prev[current_string]] = DUMMY;

				/* Replace the old node with this new one, and insert it at the start of its matching list */
				prev[current_string] = string_list_head;
				next[current_string] = next[string_list_head];

				if (next[current_string] != DUMMY)
					prev[next[current_string]] = current_string;

				next[string_list_head] = current_string;
			}

			/* At this point, the edges will have formed a shortest-path from the start to the end:
			   You just have to start at the last edge, and follow it backwards all the way to the start. */

			/* Mark start/end nodes for the following loops */
			node_meta_array[0].previous_node_index = DUMMY;
			node_meta_array[total_values].u.next_node_index = DUMMY;

			/* Reverse the direction of the edges, so we can parse the LZSS graph from start to end */
			for (i = total_values; node_meta_array[i].previous_node_index != DUMMY; i = node_meta_array[i].previous_node_index)
				node_meta_array[node_meta_array[i].previous_node_index].u.next_node_index = i;

			/* Produce an array of LZSS matches for the caller to process. It's safe to overwrite the LZSS graph to do this. */
			matches = (ClownLZSS_Match*)node_meta_array;
			total_matches = 0;

			i = 0;
			while (node_meta_array[i].u.next_node_index != DUMMY)
			{
				const size_t next_index = node_meta_array[i].u.next_node_index;
				const size_t offset = node_meta_array[next_index].match_offset;

				matches[total_matches].source = offset;
				matches[total_matches].destination = i;
				matches[total_matches].length = next_index - i;

				++total_matches;

				i = next_index;
			}

			*_matches = matches;
			*_total_matches = total_matches;
			success = 1;
		}
	}

	return success;
}